

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void fdatasync_cb(uv_fs_t *req)

{
  int iVar1;
  int r;
  uv_fs_t *req_local;
  
  if (req != &fdatasync_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x1d7,"req == &fdatasync_req");
    abort();
  }
  if (fdatasync_req.fs_type != UV_FS_FDATASYNC) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x1d8,"req->fs_type == UV_FS_FDATASYNC");
    abort();
  }
  if (fdatasync_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x1d9,"req->result == 0");
    abort();
  }
  fdatasync_cb_count = fdatasync_cb_count + 1;
  uv_fs_req_cleanup(&fdatasync_req);
  iVar1 = uv_fs_fsync(loop,&fsync_req,(uv_file)open_req1.result,fsync_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x1dd,"r == 0");
    abort();
  }
  return;
}

Assistant:

static void fdatasync_cb(uv_fs_t* req) {
  int r;
  ASSERT(req == &fdatasync_req);
  ASSERT(req->fs_type == UV_FS_FDATASYNC);
  ASSERT(req->result == 0);
  fdatasync_cb_count++;
  uv_fs_req_cleanup(req);
  r = uv_fs_fsync(loop, &fsync_req, open_req1.result, fsync_cb);
  ASSERT(r == 0);
}